

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_insert_node_ordby_schema(lyd_node *parent,lyd_node **first_sibling,lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *sibling;
  bool bVar3;
  
  if ((first_sibling == (lyd_node **)0x0) || (node == (lyd_node *)0x0)) {
    __assert_fail("first_sibling && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x2d2,
                  "void lyd_insert_node_ordby_schema(struct lyd_node *, struct lyd_node **, struct lyd_node *)"
                 );
  }
  plVar1 = lyd_insert_node_find_anchor(*first_sibling,node);
  if (plVar1 == (lyd_node *)0x0) {
    plVar1 = *first_sibling;
    if (((plVar1 == (lyd_node *)0x0) || (node->schema == (lysc_node *)0x0)) ||
       (plVar2 = plVar1->prev, plVar1->prev->schema != (lysc_node *)0x0)) {
      lyd_insert_node_last(parent,first_sibling,node);
      return;
    }
    do {
      sibling = plVar2;
      if (sibling == plVar1) break;
      plVar2 = sibling->prev;
    } while (sibling->prev->schema == (lysc_node *)0x0);
    lyd_insert_before_node(sibling,node);
    plVar2 = *first_sibling;
    bVar3 = plVar2 == sibling;
  }
  else {
    lyd_insert_before_node(plVar1,node);
    plVar2 = *first_sibling;
    bVar3 = plVar2 == plVar1;
  }
  if (bVar3) {
    plVar2 = node;
  }
  *first_sibling = plVar2;
  return;
}

Assistant:

void
lyd_insert_node_ordby_schema(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node *node)
{
    struct lyd_node *anchor;

    assert(first_sibling && node);

    if ((anchor = lyd_insert_node_find_anchor(*first_sibling, node))) {
        lyd_insert_before_node(anchor, node);
        *first_sibling = *first_sibling != anchor ? *first_sibling : node;
    } else if (*first_sibling && node->schema && !(*first_sibling)->prev->schema) {
        /* cannot insert data node after opaque nodes */
        anchor = (*first_sibling)->prev;
        while ((anchor != *first_sibling) && !anchor->prev->schema) {
            anchor = anchor->prev;
        }
        lyd_insert_before_node(anchor, node);
        *first_sibling = *first_sibling != anchor ? *first_sibling : node;
    } else {
        lyd_insert_node_last(parent, first_sibling, node);
    }
}